

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeRgba1.cpp
# Opt level: O1

void tryCatchExample(char *fileName,Rgba *pixels,int width,int height)

{
  writeRgba1(fileName,pixels,width,height);
  return;
}

Assistant:

void
tryCatchExample (const char fileName[], const Rgba* pixels, int width, int height) {
    // [begin tryCatchExample]
    try
    {
        writeRgba1 (fileName, pixels, width, height);
    }
    catch (const std::exception &exc)
    {
        std::cerr << exc.what() << std::endl;
    }
    // [end tryCatchExample]
}